

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void ManagerTest<ttt::Board,mcts::RandomPlayout<ttt::Board>>(void)

{
  bool bVar1;
  void *pvVar2;
  reference ppIVar3;
  reference plVar4;
  ostream *poVar5;
  longlong id_1;
  iterator __end2;
  iterator __begin2;
  vector<long_long,_std::allocator<long_long>_> *__range2;
  int i;
  int num_rounds;
  longlong id;
  iterator __end1;
  iterator __begin1;
  vector<long_long,_std::allocator<long_long>_> *__range1_1;
  IBot<ttt::Board> *bot;
  iterator __end0;
  iterator __begin0;
  vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_> *__range1;
  vector<long_long,_std::allocator<long_long>_> bot_ids;
  vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_> bots;
  Manager<ttt::Board> manager;
  Board game;
  vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>
  *in_stack_fffffffffffffe78;
  Manager<ttt::Board> *in_stack_fffffffffffffe80;
  Board *in_stack_fffffffffffffe88;
  FixedMctsBot<ttt::Board,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_ttt::Board_&,_long_long)>
  *in_stack_fffffffffffffe90;
  Board *in_stack_fffffffffffffe98;
  Manager<ttt::Board> *in_stack_fffffffffffffea0;
  IBot<ttt::Board> *in_stack_fffffffffffffea8;
  Manager<ttt::Board> *in_stack_fffffffffffffeb0;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_108;
  undefined1 *local_100;
  int local_f8;
  int local_f4;
  longlong local_f0;
  longlong *local_e8;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_e0;
  undefined1 *local_d8;
  longlong local_d0;
  IBot<ttt::Board> *local_c8;
  IBot<ttt::Board> **local_c0;
  __normal_iterator<game::IBot<ttt::Board>_**,_std::vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>_>
  local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [24];
  void *local_90;
  code *local_88;
  void *local_70;
  undefined1 local_68 [104];
  
  ttt::Board::Board((Board *)in_stack_fffffffffffffe90);
  ::manager::Manager<ttt::Board>::Manager(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>::vector
            ((vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_> *)0x1f7798
            );
  pvVar2 = operator_new(0x20);
  local_88 = mcts::MCTS_parallel<ttt::Board,mcts::RandomPlayout<ttt::Board>>;
  generic_bots::
  FixedMctsBot<ttt::Board,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_ttt::Board_&,_long_long)>
  ::FixedMctsBot(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (_func_vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_Board_ptr_longlong
                  **)in_stack_fffffffffffffe80,(longlong)in_stack_fffffffffffffe78);
  local_70 = pvVar2;
  std::vector<game::IBot<ttt::Board>*,std::allocator<game::IBot<ttt::Board>*>>::
  emplace_back<generic_bots::FixedMctsBot<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(*)(ttt::Board_const&,long_long)>*>
            ((vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_> *)
             in_stack_fffffffffffffe90,
             (FixedMctsBot<ttt::Board,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_ttt::Board_&,_long_long)>
              **)in_stack_fffffffffffffe88);
  pvVar2 = operator_new(0x18);
  generic_bots::MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>::
  MinimaxBot((MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *)
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  local_90 = pvVar2;
  std::vector<game::IBot<ttt::Board>*,std::allocator<game::IBot<ttt::Board>*>>::
  emplace_back<generic_bots::MinimaxBot<ttt::Board,minimax::ABeta<ttt::Board,minimax::Eval<ttt::Board>>>*>
            ((vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_> *)
             in_stack_fffffffffffffe90,
             (MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> **)
             in_stack_fffffffffffffe88);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)0x1f7858);
  local_b0 = local_68;
  local_b8._M_current =
       (IBot<ttt::Board> **)
       std::vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>::begin
                 (in_stack_fffffffffffffe78);
  local_c0 = (IBot<ttt::Board> **)
             std::vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>::end
                       (in_stack_fffffffffffffe78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<game::IBot<ttt::Board>_**,_std::vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<game::IBot<ttt::Board>_**,_std::vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    ppIVar3 = __gnu_cxx::
              __normal_iterator<game::IBot<ttt::Board>_**,_std::vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>_>
              ::operator*(&local_b8);
    local_c8 = *ppIVar3;
    local_d0 = ::manager::Manager<ttt::Board>::AddBot
                         (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
              ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe90,
               (longlong *)in_stack_fffffffffffffe88);
    if (local_c8 != (IBot<ttt::Board> *)0x0) {
      (*local_c8->_vptr_IBot[1])();
    }
    __gnu_cxx::
    __normal_iterator<game::IBot<ttt::Board>_**,_std::vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>_>
    ::operator++(&local_b8);
  }
  std::operator<<((ostream *)&std::cout,"Initial ratings:");
  local_d8 = local_a8;
  local_e0._M_current =
       (longlong *)
       std::vector<long_long,_std::allocator<long_long>_>::begin
                 ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe78);
  local_e8 = (longlong *)
             std::vector<long_long,_std::allocator<long_long>_>::end
                       ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    plVar4 = __gnu_cxx::
             __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
             operator*(&local_e0);
    local_f0 = *plVar4;
    poVar5 = std::operator<<((ostream *)&std::cout,' ');
    in_stack_fffffffffffffeb0 =
         (Manager<ttt::Board> *)
         ::manager::Manager<ttt::Board>::GetBotRating
                   (in_stack_fffffffffffffe80,(longlong)in_stack_fffffffffffffe78);
    std::ostream::operator<<(poVar5,(double)in_stack_fffffffffffffeb0);
    __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
    operator++(&local_e0);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  local_f4 = 200;
  for (local_f8 = 0; local_f8 < local_f4; local_f8 = local_f8 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Round ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_f8 + 1);
    poVar5 = std::operator<<(poVar5," / ");
    in_stack_fffffffffffffe90 =
         (FixedMctsBot<ttt::Board,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_ttt::Board_&,_long_long)>
          *)std::ostream::operator<<(poVar5,local_f4);
    std::operator<<((ostream *)in_stack_fffffffffffffe90,'\n');
    ::manager::Manager<ttt::Board>::RoundRobin(in_stack_fffffffffffffeb0);
    std::operator<<((ostream *)&std::cout,"New ratings:");
    local_100 = local_a8;
    local_108._M_current =
         (longlong *)
         std::vector<long_long,_std::allocator<long_long>_>::begin
                   ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe78);
    std::vector<long_long,_std::allocator<long_long>_>::end
              ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe78);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
      ::operator*(&local_108);
      poVar5 = std::operator<<((ostream *)&std::cout,' ');
      in_stack_fffffffffffffe80 =
           (Manager<ttt::Board> *)
           ::manager::Manager<ttt::Board>::GetBotRating
                     (in_stack_fffffffffffffe80,(longlong)in_stack_fffffffffffffe78);
      std::ostream::operator<<(poVar5,(double)in_stack_fffffffffffffe80);
      __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
      ::operator++(&local_108);
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe90);
  std::vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>::~vector
            ((vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_> *)
             in_stack_fffffffffffffe90);
  ::manager::Manager<ttt::Board>::~Manager(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void
ManagerTest()
{
    IGame game;
    manager::Manager<IGame> manager(&game);

    std::vector<game::IBot<IGame> *> bots;
    bots.emplace_back(new generic_bots::FixedMctsBot<IGame, std::vector<mcts::MCTSResults> (*)(const IGame &, long long)>(&game, mcts::MCTS_parallel<IGame, RandomPlayout>, 1000));
    bots.emplace_back(new generic_bots::MinimaxBot<IGame, minimax::ABeta<IGame>>(&game, 9));

    std::vector<long long> bot_ids;
    for (auto bot : bots)
    {
        bot_ids.emplace_back(manager.AddBot(bot));
        delete bot;
    }

    std::cout << "Initial ratings:";
    for (long long id : bot_ids)
        std::cout << ' ' << manager.GetBotRating(id);
    std::cout << '\n';

    int num_rounds = 200;
    for (int i = 0; i < num_rounds; ++i)
    {
        std::cout << "Round " << i + 1 << " / " << num_rounds << '\n';
        manager.RoundRobin();
        std::cout << "New ratings:";
        for (long long id : bot_ids)
            std::cout << ' ' << manager.GetBotRating(id);
        std::cout << '\n';
    }
}